

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a5660 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a5667 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a5650 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a5658 = 0x2d2d2d2d2d2d2d;
    DAT_001a565f = 0x2d;
    _DAT_001a5640 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a5648 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a5630 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a5638 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a5628 = 0x2d2d2d2d2d2d2d2d;
    DAT_001a566f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }